

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O1

void EvpathNotifyConnFailure(CP_Services Svcs,DP_RS_Stream Stream_v,int FailedPeerRank)

{
  bool bVar1;
  CManager p_Var2;
  uint *puVar3;
  
  p_Var2 = (*Svcs->getCManager)(*(void **)((long)Stream_v + 8));
  (*Svcs->verbose)(*(void **)((long)Stream_v + 8),4,
                   "received notification that writer peer %d has failed, failing any pending requests\n"
                   ,(ulong)(uint)FailedPeerRank);
  (*Svcs->verbose)(*(void **)((long)Stream_v + 8),5,
                   "Fail pending requests to rank %d on stream %p\n",(ulong)(uint)FailedPeerRank,
                   Stream_v);
  pthread_mutex_lock((pthread_mutex_t *)((long)Stream_v + 0x18));
  puVar3 = *(uint **)((long)Stream_v + 0x58);
  if (puVar3 != (uint *)0x0) {
    bVar1 = false;
    do {
      if ((puVar3[10] != 1) && (puVar3[0xb] == FailedPeerRank)) {
        puVar3[10] = 1;
        (*Svcs->verbose)(*(void **)(puVar3 + 4),5,
                         "Found a pending remote memory read to writer rank %d, marking as failed and signalling condition %d\n"
                         ,(ulong)puVar3[0xb],(ulong)*puVar3);
        CMCondition_signal(p_Var2,*puVar3);
        (*Svcs->verbose)(*(void **)(puVar3 + 4),5,"Did the signal of condition %d\n",
                         (ulong)puVar3[0xb],(ulong)*puVar3);
        bVar1 = true;
      }
      puVar3 = *(uint **)(puVar3 + 0x10);
    } while (puVar3 != (uint *)0x0);
    if (bVar1) {
      puVar3 = *(uint **)((long)Stream_v + 0x58);
      (*Svcs->verbose)(*(void **)((long)Stream_v + 8),5,
                       "We were waiting for requests on rank %d, fail *all* pending requests on stream %p\n"
                       ,(ulong)(uint)FailedPeerRank,Stream_v);
      for (; puVar3 != (uint *)0x0; puVar3 = *(uint **)(puVar3 + 0x10)) {
        if (puVar3[10] != 1) {
          puVar3[10] = 1;
          (*Svcs->verbose)(*(void **)(puVar3 + 4),5,
                           "Found a pending remote memory read to writer rank %d, marking as failed and signalling condition %d\n"
                           ,(ulong)puVar3[0xb],(ulong)*puVar3);
          CMCondition_signal(p_Var2,*puVar3);
          (*Svcs->verbose)(*(void **)(puVar3 + 4),5,"Did the signal of condition %d\n",
                           (ulong)puVar3[0xb],(ulong)*puVar3);
        }
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)Stream_v + 0x18));
  (*Svcs->verbose)(*(void **)((long)Stream_v + 8),4,
                   "Done Failing requests to writer %d from stream %p\n",(ulong)(uint)FailedPeerRank
                   ,Stream_v,Svcs->verbose);
  return;
}

Assistant:

static void EvpathNotifyConnFailure(CP_Services Svcs, DP_RS_Stream Stream_v, int FailedPeerRank)
{
    Evpath_RS_Stream Stream =
        (Evpath_RS_Stream)Stream_v; /* DP_RS_Stream is the return from InitReader */
    CManager cm = Svcs->getCManager(Stream->CP_Stream);
    Svcs->verbose(Stream->CP_Stream, DPPerRankVerbose,
                  "received notification that writer peer "
                  "%d has failed, failing any pending "
                  "requests\n",
                  FailedPeerRank);
    FailRequestsToRank(Svcs, cm, Stream, FailedPeerRank);
}